

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O0

bool __thiscall IR::Float32ConstOpnd::IsEqualInternal(Float32ConstOpnd *this,Opnd *opnd)

{
  float fVar1;
  code *pcVar2;
  bool bVar3;
  IRType IVar4;
  IRType IVar5;
  undefined4 *puVar6;
  Float32ConstOpnd *pFVar7;
  Opnd *opnd_local;
  Float32ConstOpnd *this_local;
  
  if ((this->super_Opnd).m_kind != OpndKindFloat32Const) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                       ,0x74c,"(m_kind == OpndKindFloat32Const)","m_kind == OpndKindFloat32Const");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  bVar3 = Opnd::IsFloat32ConstOpnd(opnd);
  if (bVar3) {
    IVar4 = Opnd::GetType(&this->super_Opnd);
    IVar5 = Opnd::GetType(opnd);
    if (IVar4 == IVar5) {
      fVar1 = this->m_value;
      pFVar7 = Opnd::AsFloat32ConstOpnd(opnd);
      return fVar1 == pFVar7->m_value;
    }
  }
  return false;
}

Assistant:

bool
Float32ConstOpnd::IsEqualInternal(Opnd *opnd)
{
    Assert(m_kind == OpndKindFloat32Const);
    if (!opnd->IsFloat32ConstOpnd() || this->GetType() != opnd->GetType() /* TODO: could this be turned into an assert*/)
    {
        return false;
    }

    return m_value == opnd->AsFloat32ConstOpnd()->m_value;
}